

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O2

BOOL objc_bitfield_test(uintptr_t bitfield,uint64_t field)

{
  if ((bitfield & 1) != 0) {
    return ((long)(1 << ((char)field + 1U & 0x1f)) & ~bitfield) == 0;
  }
  if (field >> 5 < (ulong)(long)*(int *)bitfield) {
    return (*(uint *)(bitfield + 4 + (field >> 5) * 4) >> ((uint)field & 0x1f) & 1) != 0;
  }
  return '\0';
}

Assistant:

static inline BOOL objc_bitfield_test(uintptr_t bitfield, uint64_t field)
{
	if (bitfield & 1)
	{
		uint64_t bit = 1<<(field+1);
		return (bitfield & bit) == bit;
	}
	struct objc_bitfield *bf = (struct objc_bitfield*)bitfield;
	uint64_t byte = field / 32;
	if (byte >= bf->length)
	{
		return NO;
	}
	uint64_t bit = 1<<(field%32);
	return (bf->values[byte] & bit) == bit;
}